

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::~QPainter(QPainter *this)

{
  bool bVar1;
  pointer pQVar2;
  unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *in_RDI;
  QPainterPrivate *unaff_retaddr;
  unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *q;
  
  q = in_RDI;
  pQVar2 = std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::operator->
                     ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)0x59421c
                     );
  pQVar2->field_0xf8 = pQVar2->field_0xf8 & 0xfd | 2;
  bVar1 = isActive((QPainter *)in_RDI);
  if (bVar1) {
    end((QPainter *)unaff_retaddr);
  }
  else {
    pQVar2 = std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::operator->
                       ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)
                        0x594254);
    if (1 < pQVar2->refcount) {
      std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::operator->
                ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)0x594267);
      QPainterPrivate::detachPainterPrivate(unaff_retaddr,(QPainter *)q);
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)0x594280)
  ;
  if (bVar1) {
    pQVar2 = std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::operator->
                       ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)
                        0x594290);
    pQVar2->field_0xf8 = pQVar2->field_0xf8 & 0xfd;
  }
  std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::~unique_ptr(in_RDI);
  return;
}

Assistant:

QPainter::~QPainter()
{
    d_ptr->inDestructor = true;
    QT_TRY {
        if (isActive())
            end();
        else if (d_ptr->refcount > 1)
            d_ptr->detachPainterPrivate(this);
    }